

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrImage.c
# Opt level: O2

DdNode * Bbr_bddComputeCube(DdManager *dd,DdNode **bXVars,int nVars)

{
  DdNode *n;
  ulong uVar1;
  ulong uVar2;
  DdNode *n_00;
  
  n_00 = dd->one;
  Cudd_Ref(n_00);
  uVar2 = 0;
  uVar1 = (ulong)(uint)nVars;
  if (nVars < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    n = Cudd_bddAnd(dd,n_00,bXVars[uVar2]);
    Cudd_Ref(n);
    Cudd_RecursiveDeref(dd,n_00);
    n_00 = n;
  }
  Cudd_Deref(n_00);
  return n_00;
}

Assistant:

DdNode * Bbr_bddComputeCube( DdManager * dd, DdNode ** bXVars, int nVars )
{
    DdNode * bRes;
    DdNode * bTemp;
    int i;

    bRes = b1; Cudd_Ref( bRes );
    for ( i = 0; i < nVars; i++ )
    {
        bRes = Cudd_bddAnd( dd, bTemp = bRes, bXVars[i] );  Cudd_Ref( bRes );
        Cudd_RecursiveDeref( dd, bTemp );
    }

    Cudd_Deref( bRes );
    return bRes;
}